

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDErrorReporter.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSDErrorReporter::emitError
          (XSDErrorReporter *this,uint toEmit,XMLCh *msgDomain,Locator *aLocator)

{
  XMLErrorReporter *pXVar1;
  bool bVar2;
  ErrTypes EVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint *puVar8;
  long *plVar9;
  XMLCh errText [1024];
  
  plVar9 = gErrMsgLoader;
  EVar3 = XMLErrs::errorType(toEmit);
  bVar2 = XMLString::equals(msgDomain,(XMLCh *)XMLUni::fgValidityDomain);
  if (bVar2) {
    EVar3 = XMLValid::errorType(toEmit);
    plVar9 = gValidMsgLoader;
  }
  (**(code **)(*plVar9 + 0x10))(plVar9,toEmit,errText,0x3ff);
  pXVar1 = this->fErrorReporter;
  if (pXVar1 != (XMLErrorReporter *)0x0) {
    iVar4 = (*aLocator->_vptr_Locator[3])(aLocator);
    iVar5 = (*aLocator->_vptr_Locator[2])(aLocator);
    iVar6 = (*aLocator->_vptr_Locator[4])(aLocator);
    iVar7 = (*aLocator->_vptr_Locator[5])(aLocator);
    (*pXVar1->_vptr_XMLErrorReporter[2])
              (pXVar1,toEmit,msgDomain,(ulong)EVar3,errText,CONCAT44(extraout_var,iVar4),
               CONCAT44(extraout_var_00,iVar5),CONCAT44(extraout_var_01,iVar6),
               CONCAT44(extraout_var_02,iVar7));
  }
  if ((EVar3 == ErrType_Fatal) && (this->fExitOnFirstFatal == true)) {
    puVar8 = (uint *)__cxa_allocate_exception(4);
    *puVar8 = toEmit;
    __cxa_throw(puVar8,&XMLErrs::Codes::typeinfo,0);
  }
  return;
}

Assistant:

void XSDErrorReporter::emitError(const unsigned int toEmit,
                                 const XMLCh* const msgDomain,
                                 const Locator* const aLocator)
{
    // Bump the error count if it is not a warning
//    if (XMLErrs::errorType(toEmit) != XMLErrorReporter::ErrType_Warning)
//        incrementErrorCount();

    //
    //  Load the message into alocal and replace any tokens found in
    //  the text.
    //
    const XMLSize_t msgSize = 1023;
    XMLCh errText[msgSize + 1];
    XMLMsgLoader* msgLoader = gErrMsgLoader;
    XMLErrorReporter::ErrTypes errType = XMLErrs::errorType((XMLErrs::Codes) toEmit);

    if (XMLString::equals(msgDomain, XMLUni::fgValidityDomain)) {

        errType = XMLValid::errorType((XMLValid::Codes) toEmit);
        msgLoader = gValidMsgLoader;
    }

    if (!msgLoader->loadMsg(toEmit, errText, msgSize))
    {
                // <TBD> Should probably load a default message here
    }

    if (fErrorReporter)
        fErrorReporter->error(toEmit, msgDomain, errType, errText, aLocator->getSystemId(),
                              aLocator->getPublicId(), aLocator->getLineNumber(),
                              aLocator->getColumnNumber());

    // Bail out if its fatal an we are to give up on the first fatal error
    if (errType == XMLErrorReporter::ErrType_Fatal && fExitOnFirstFatal)
        throw (XMLErrs::Codes) toEmit;
}